

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O0

ATNPath * __thiscall Centaurus::ATNPath::parent_path(ATNPath *__return_storage_ptr__,ATNPath *this)

{
  ATNPath *this_local;
  ATNPath *new_path;
  
  ATNPath(__return_storage_ptr__,this);
  pop(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ATNPath parent_path() const
    {
        ATNPath new_path(*this);

        new_path.pop();

        return new_path;
    }